

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O0

void __thiscall unitOps_root_Test::TestBody(unitOps_root_Test *this)

{
  bool bVar1;
  char *pcVar2;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  double __x_07;
  double in_XMM1_Qa;
  AssertHelper local_3a0;
  Message local_398;
  unit local_390;
  unit local_388;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_18;
  Message local_368;
  unit local_360;
  unit local_358;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_17;
  Message local_338;
  unit local_330;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_16;
  unit ft5;
  Message local_308;
  unit local_300;
  unit local_2f8;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_15;
  Message local_2d8;
  unit local_2d0;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_14;
  Message local_2b0;
  unit local_2a8;
  unit local_2a0;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_13;
  unit ft4;
  Message local_278;
  unit local_270;
  unit local_268;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_12;
  Message local_248;
  unit local_240;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_11;
  unit ft3;
  Message local_218;
  unit local_210;
  unit local_208;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_10;
  Message local_1e8;
  unit local_1e0;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_9;
  unit ft2;
  Message local_1b8;
  unit local_1b0;
  unit local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_8;
  Message local_188;
  unit local_180;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_7;
  unit ft1;
  Message local_158;
  unit local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_6;
  Message local_130;
  unit local_128;
  unit local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_5;
  unit m4;
  Message local_f8;
  unit local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_4;
  Message local_d0;
  unit local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_3;
  unit m2;
  Message local_a0;
  unit local_98;
  unit local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_2;
  Message local_70;
  unit local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  unit m1;
  Message local_40 [3];
  unit local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  unitOps_root_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_28 = units::root((unit *)&units::m,0);
  testing::internal::EqHelper::Compare<units::unit,_units::unit,_nullptr>
            ((EqHelper *)local_20,"root(m, 0)","one",&local_28,(unit *)&units::one);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x52,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m1,local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m1);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  units::unit::pow((unit *)&units::m,__x,in_XMM1_Qa);
  local_68 = units::root((unit *)&gtest_ar_1.message_,1);
  testing::internal::EqHelper::Compare<units::unit,_units::unit,_nullptr>
            ((EqHelper *)local_60,"m","root(m1, 1)",(unit *)&units::m,&local_68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  local_90 = units::unit::inv((unit *)&units::m);
  local_98 = units::root((unit *)&gtest_ar_1.message_,-1);
  testing::internal::EqHelper::Compare<units::unit,_units::unit,_nullptr>
            ((EqHelper *)local_88,"m.inv()","root(m1, -1)",&local_90,&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m2,&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m2);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  units::pow((units *)&units::m,__x_00,in_XMM1_Qa);
  local_c8 = units::root((unit *)&gtest_ar_3.message_,2);
  testing::internal::EqHelper::Compare<units::unit,_units::unit,_nullptr>
            ((EqHelper *)local_c0,"m","root(m2, 2)",(unit *)&units::m,&local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  units::sqrt(__x_01);
  testing::internal::EqHelper::Compare<units::unit,_units::unit,_nullptr>
            ((EqHelper *)local_e8,"m","sqrt(m2)",(unit *)&units::m,&local_f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x59,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m4,&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m4);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  units::unit::pow((unit *)&units::m,__x_02,in_XMM1_Qa);
  local_120 = units::unit::operator*((unit *)&units::m,(unit *)&units::m);
  local_128 = units::root((unit *)&gtest_ar_5.message_,2);
  testing::internal::EqHelper::Compare<units::unit,_units::unit,_nullptr>
            ((EqHelper *)local_118,"m * m","root(m4, 2)",&local_120,&local_128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x5c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  local_150 = units::root((unit *)&gtest_ar_5.message_,4);
  testing::internal::EqHelper::Compare<units::unit,_units::unit,_nullptr>
            ((EqHelper *)local_148,"m","root(m4, 4)",(unit *)&units::m,&local_150);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ft1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x5d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&ft1,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ft1);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  units::unit::pow((unit *)&units::ft,__x_03,in_XMM1_Qa);
  local_180 = units::root((unit *)&gtest_ar_7.message_,1);
  testing::internal::EqHelper::Compare<units::unit,_units::unit,_nullptr>
            ((EqHelper *)local_178,"ft","root(ft1, 1)",(unit *)&units::ft,&local_180);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x60,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  local_1a8 = units::unit::inv((unit *)&units::ft);
  local_1b0 = units::root((unit *)&gtest_ar_7.message_,-1);
  testing::internal::EqHelper::Compare<units::unit,_units::unit,_nullptr>
            ((EqHelper *)local_1a0,"ft.inv()","root(ft1, -1)",&local_1a8,&local_1b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ft2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x61,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&ft2,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ft2);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  units::unit::pow((unit *)&units::ft,__x_04,in_XMM1_Qa);
  local_1e0 = units::root((unit *)&gtest_ar_9.message_,2);
  testing::internal::EqHelper::Compare<units::unit,_units::unit,_nullptr>
            ((EqHelper *)local_1d8,"ft","root(ft2, 2)",(unit *)&units::ft,&local_1e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,100,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  local_208 = units::unit::inv((unit *)&units::ft);
  local_210 = units::root((unit *)&gtest_ar_9.message_,-2);
  testing::internal::EqHelper::Compare<units::unit,_units::unit,_nullptr>
            ((EqHelper *)local_200,"ft.inv()","root(ft2, -2)",&local_208,&local_210);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ft3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x65,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&ft3,&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ft3);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  units::unit::pow((unit *)&units::ft,__x_05,in_XMM1_Qa);
  local_240 = units::root((unit *)&gtest_ar_11.message_,3);
  testing::internal::EqHelper::Compare<units::unit,_units::unit,_nullptr>
            ((EqHelper *)local_238,"ft","root(ft3, 3)",(unit *)&units::ft,&local_240);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x67,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  local_268 = units::unit::inv((unit *)&units::ft);
  local_270 = units::root((unit *)&gtest_ar_11.message_,-3);
  testing::internal::EqHelper::Compare<units::unit,_units::unit,_nullptr>
            ((EqHelper *)local_260,"ft.inv()","root(ft3, -3)",&local_268,&local_270);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(&local_278);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ft4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&ft4,&local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ft4);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  units::unit::pow((unit *)&units::ft,__x_06,in_XMM1_Qa);
  local_2a0 = units::unit::operator*((unit *)&units::ft,(unit *)&units::ft);
  local_2a8 = units::root((unit *)&gtest_ar_13.message_,2);
  testing::internal::EqHelper::Compare<units::unit,_units::unit,_nullptr>
            ((EqHelper *)local_298,"ft * ft","root(ft4, 2)",&local_2a0,&local_2a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x6a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  local_2d0 = units::root((unit *)&gtest_ar_13.message_,4);
  testing::internal::EqHelper::Compare<units::unit,_units::unit,_nullptr>
            ((EqHelper *)local_2c8,"ft","root(ft4, 4)",(unit *)&units::ft,&local_2d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x6b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  local_2f8 = units::unit::inv((unit *)&units::ft);
  local_300 = units::root((unit *)&gtest_ar_13.message_,-4);
  testing::internal::EqHelper::Compare<units::unit,_units::unit,_nullptr>
            ((EqHelper *)local_2f0,"ft.inv()","root(ft4, -4)",&local_2f8,&local_300);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar1) {
    testing::Message::Message(&local_308);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ft5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x6c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&ft5,&local_308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ft5);
    testing::Message::~Message(&local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  units::unit::pow((unit *)&units::ft,__x_07,in_XMM1_Qa);
  local_330 = units::root((unit *)&gtest_ar_16.message_,5);
  testing::internal::EqHelper::Compare<units::unit,_units::unit,_nullptr>
            ((EqHelper *)local_328,"ft","root(ft5, 5)",(unit *)&units::ft,&local_330);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  local_358 = units::unit::inv((unit *)&units::ft);
  local_360 = units::root((unit *)&gtest_ar_16.message_,-5);
  testing::internal::EqHelper::Compare<units::unit,_units::unit,_nullptr>
            ((EqHelper *)local_350,"ft.inv()","root(ft5, -5)",&local_358,&local_360);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar1) {
    testing::Message::Message(&local_368);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x70,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_368);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  units::unit::unit(&local_390,-4.5,(unit *)&units::m);
  local_388 = units::root(&local_390,2);
  testing::internal::EqHelper::Compare<units::unit,_units::unit,_nullptr>
            ((EqHelper *)local_380,"root(unit(-4.5, m), 2)","error",&local_388,(unit *)&units::error
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
  if (!bVar1) {
    testing::Message::Message(&local_398);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x72,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3a0,&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
  return;
}

Assistant:

TEST(unitOps, root)
{
    EXPECT_EQ(root(m, 0), one);
    auto m1 = m.pow(1);
    EXPECT_EQ(m, root(m1, 1));
    EXPECT_EQ(m.inv(), root(m1, -1));
    auto m2 = pow(m, 2);
    EXPECT_EQ(m, root(m2, 2));

    EXPECT_EQ(m, sqrt(m2));

    auto m4 = m.pow(4);
    EXPECT_EQ(m * m, root(m4, 2));
    EXPECT_EQ(m, root(m4, 4));

    auto ft1 = ft.pow(1);
    EXPECT_EQ(ft, root(ft1, 1));
    EXPECT_EQ(ft.inv(), root(ft1, -1));

    auto ft2 = ft.pow(2);
    EXPECT_EQ(ft, root(ft2, 2));
    EXPECT_EQ(ft.inv(), root(ft2, -2));
    auto ft3 = ft.pow(3);
    EXPECT_EQ(ft, root(ft3, 3));
    EXPECT_EQ(ft.inv(), root(ft3, -3));
    auto ft4 = ft.pow(4);
    EXPECT_EQ(ft * ft, root(ft4, 2));
    EXPECT_EQ(ft, root(ft4, 4));
    EXPECT_EQ(ft.inv(), root(ft4, -4));

    auto ft5 = ft.pow(5);
    EXPECT_EQ(ft, root(ft5, 5));
    EXPECT_EQ(ft.inv(), root(ft5, -5));

    EXPECT_EQ(root(unit(-4.5, m), 2), error);
}